

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void fill_pointers(pixels *p,exr_coding_channel_info_t *curchan,int32_t idxoffset,void **ptr,
                  int32_t *pixelstride,int32_t *linestride)

{
  int iVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  uint *puVar4;
  ostream *poVar5;
  char *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  char *in_R8;
  int *in_R9;
  char *in_stack_ffffffffffffffc8;
  
  iVar1 = strcmp((char *)*in_RSI,"A");
  if (iVar1 == 0) {
    puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x11939c);
    *(unsigned_short **)in_RCX = puVar2 + in_EDX;
    in_R8[0] = '\x02';
    in_R8[1] = '\0';
    in_R8[2] = '\0';
    in_R8[3] = '\0';
    *in_R9 = *(int *)(in_RDI + 8) << 1;
  }
  else {
    iVar1 = strcmp((char *)*in_RSI,"B");
    if (iVar1 == 0) {
      puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1193fe);
      *(unsigned_short **)in_RCX = puVar2 + in_EDX;
      in_R8[0] = '\x02';
      in_R8[1] = '\0';
      in_R8[2] = '\0';
      in_R8[3] = '\0';
      *in_R9 = *(int *)(in_RDI + 8) << 1;
    }
    else {
      iVar1 = strcmp((char *)*in_RSI,"G");
      if (iVar1 == 0) {
        puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x119460);
        *(unsigned_short **)in_RCX = puVar2 + in_EDX;
        in_R8[0] = '\x02';
        in_R8[1] = '\0';
        in_R8[2] = '\0';
        in_R8[3] = '\0';
        *in_R9 = *(int *)(in_RDI + 8) << 1;
      }
      else {
        iVar1 = strcmp((char *)*in_RSI,"R");
        if (iVar1 == 0) {
          puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1194be);
          *(unsigned_short **)in_RCX = puVar2 + in_EDX;
          in_R8[0] = '\x02';
          in_R8[1] = '\0';
          in_R8[2] = '\0';
          in_R8[3] = '\0';
          *in_R9 = *(int *)(in_RDI + 8) << 1;
        }
        else {
          iVar1 = strcmp((char *)*in_RSI,"H");
          if (iVar1 == 0) {
            puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x11951c)
            ;
            *(unsigned_short **)in_RCX = puVar2 + in_EDX;
            in_R8[0] = '\x02';
            in_R8[1] = '\0';
            in_R8[2] = '\0';
            in_R8[3] = '\0';
            *in_R9 = *(int *)(in_RDI + 8) << 1;
          }
          else {
            iVar1 = strcmp((char *)*in_RSI,"F");
            if (iVar1 == 0) {
              pfVar3 = std::vector<float,_std::allocator<float>_>::data
                                 ((vector<float,_std::allocator<float>_> *)0x11957a);
              *(float **)in_RCX = pfVar3 + in_EDX;
              in_R8[0] = '\x04';
              in_R8[1] = '\0';
              in_R8[2] = '\0';
              in_R8[3] = '\0';
              *in_R9 = *(int *)(in_RDI + 8) << 2;
            }
            else {
              iVar1 = strcmp((char *)*in_RSI,"I");
              if (iVar1 == 0) {
                puVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1195da)
                ;
                *(uint **)in_RCX = puVar4 + in_EDX;
                in_R8[0] = '\x04';
                in_R8[1] = '\0';
                in_R8[2] = '\0';
                in_R8[3] = '\0';
                *in_R9 = *(int *)(in_RDI + 8) << 2;
              }
              else {
                poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown channel name \'");
                poVar5 = std::operator<<(poVar5,(char *)*in_RSI);
                poVar5 = std::operator<<(poVar5,"\'");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                core_test_fail(in_RCX,in_R8,(uint)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8);
                in_RCX[0] = '\0';
                in_RCX[1] = '\0';
                in_RCX[2] = '\0';
                in_RCX[3] = '\0';
                in_RCX[4] = '\0';
                in_RCX[5] = '\0';
                in_RCX[6] = '\0';
                in_RCX[7] = '\0';
                in_R8[0] = -1;
                in_R8[1] = -1;
                in_R8[2] = -1;
                in_R8[3] = -1;
                *in_R9 = -1;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
fill_pointers (
    pixels&                          p,
    const exr_coding_channel_info_t& curchan,
    int32_t                          idxoffset,
    void**                           ptr,
    int32_t*                         pixelstride,
    int32_t*                         linestride)
{
    if (!strcmp (curchan.channel_name, "A"))
    {
        *ptr         = p.rgba[3].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "B"))
    {
        *ptr         = p.rgba[2].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "G"))
    {
        *ptr         = p.rgba[1].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "R"))
    {
        *ptr         = p.rgba[0].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "H"))
    {
        *ptr         = p.h.data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "F"))
    {
        *ptr         = p.f.data () + idxoffset;
        *pixelstride = 4;
        *linestride  = 4 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "I"))
    {
        *ptr         = p.i.data () + idxoffset;
        *pixelstride = 4;
        *linestride  = 4 * p._stride_x;
    }
    else
    {
        std::cerr << "Unknown channel name '" << curchan.channel_name << "'"
                  << std::endl;
        EXRCORE_TEST (false);
        *ptr         = nullptr;
        *pixelstride = -1;
        *linestride  = -1;
    }
}